

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O0

bool __thiscall
bssl::SSLTranscript::AddToBufferOrHash(SSLTranscript *this,Span<const_unsigned_char> in)

{
  bool bVar1;
  int iVar2;
  pointer buf;
  EVP_MD_CTX *pEVar3;
  EVP_MD *pEVar4;
  uchar *puVar5;
  size_t sVar6;
  SSLTranscript *this_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  this_local = (SSLTranscript *)in.data_;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    buf = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::get(&this->buffer_);
    puVar5 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
    sVar6 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
    iVar2 = BUF_MEM_append(buf,puVar5,sVar6);
    if (iVar2 == 0) {
      return false;
    }
  }
  pEVar3 = (EVP_MD_CTX *)
           internal::
           StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
           ::get(&this->hash_);
  pEVar4 = EVP_MD_CTX_md(pEVar3);
  if (pEVar4 != (EVP_MD *)0x0) {
    pEVar3 = (EVP_MD_CTX *)
             internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get(&this->hash_);
    puVar5 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
    sVar6 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
    EVP_DigestUpdate(pEVar3,puVar5,sVar6);
  }
  return true;
}

Assistant:

bool SSLTranscript::AddToBufferOrHash(Span<const uint8_t> in) {
  // Depending on the state of the handshake, either the handshake buffer may be
  // active, the rolling hash, or both.
  if (buffer_ &&  //
      !BUF_MEM_append(buffer_.get(), in.data(), in.size())) {
    return false;
  }

  if (EVP_MD_CTX_md(hash_.get()) != NULL) {
    EVP_DigestUpdate(hash_.get(), in.data(), in.size());
  }

  return true;
}